

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# monster_test_json_parser.h
# Opt level: O3

char * MyGame_Example_Stat_parse_json_table
                 (flatcc_json_parser_t *ctx,char *buf,char *end,flatcc_builder_ref_t *result)

{
  byte bVar1;
  short sVar2;
  int iVar3;
  flatcc_builder_ref_t fVar4;
  char *pcVar5;
  ulong uVar6;
  ulong uVar7;
  short *psVar8;
  flatcc_builder_ref_t *pfVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  byte *pbVar13;
  ulong uVar14;
  ulong uVar15;
  ulong *puVar16;
  bool bVar17;
  int more;
  uint64_t value;
  flatcc_builder_ref_t ref;
  int local_50;
  uint local_4c;
  ulong local_48;
  uint64_t local_40;
  int local_34;
  
  *result = 0;
  iVar3 = flatcc_builder_start_table(ctx->ctx,3);
  if (iVar3 != 0) goto LAB_00112031;
  if ((buf == end) || (*buf != '{')) {
    local_50 = 0;
    buf = flatcc_json_parser_set_error(ctx,buf,end,0x15);
  }
  else {
    puVar16 = (ulong *)(buf + 1);
    if ((long)end - (long)puVar16 < 2) {
LAB_0011206a:
      puVar16 = (ulong *)flatcc_json_parser_space_ext(ctx,(char *)puVar16,end);
    }
    else if ((char)(byte)*puVar16 < '!') {
      if (((byte)*puVar16 != 0x20) || (buf[2] < '!')) goto LAB_0011206a;
      puVar16 = (ulong *)(buf + 2);
    }
    if ((puVar16 == (ulong *)end) || ((byte)*puVar16 != 0x7d)) {
      local_50 = 1;
      buf = (char *)puVar16;
      do {
        if (buf != end) {
          if ((byte)*(ulong *)buf == 0x2e) {
            buf = flatcc_json_parser_set_error(ctx,buf,end,5);
          }
          else if ((byte)*(ulong *)buf == 0x22) {
            buf = (char *)((long)buf + 1);
            ctx->unquoted = 0;
          }
          else {
            ctx->unquoted = 1;
          }
        }
        uVar10 = (long)end - (long)buf;
        if (uVar10 < 8) {
          uVar11 = 0;
          uVar7 = 0;
          uVar12 = 0;
          uVar14 = 0;
          uVar15 = 0;
          uVar6 = 0;
          switch(uVar10) {
          case 7:
            uVar11 = (long)(char)*(byte *)((long)buf + 6) << 8;
          case 6:
            uVar7 = (long)(char)*(byte *)((long)buf + 5) << 0x10 | uVar11;
          case 5:
            uVar12 = (long)(char)*(byte *)((long)buf + 4) << 0x18 | uVar7;
          case 4:
            uVar14 = (long)(char)*(byte *)((long)buf + 3) << 0x20 | uVar12;
          case 3:
            uVar15 = (long)(char)*(byte *)((long)buf + 2) << 0x28 | uVar14;
          case 2:
            uVar6 = (long)(char)*(byte *)((long)buf + 1) << 0x30 | uVar15;
          case 1:
            uVar6 = (ulong)(byte)*(ulong *)buf << 0x38 | uVar6;
            goto LAB_001121a8;
          }
switchD_0011214e_default:
          buf = flatcc_json_parser_unmatched_symbol(ctx,buf,end);
        }
        else {
          uVar7 = *(ulong *)buf;
          uVar6 = uVar7 >> 0x38 | (uVar7 & 0xff000000000000) >> 0x28 |
                  (uVar7 & 0xff0000000000) >> 0x18 | (uVar7 & 0xff00000000) >> 8 |
                  (uVar7 & 0xff000000) << 8 | (uVar7 & 0xff0000) << 0x18 | (uVar7 & 0xff00) << 0x28
                  | uVar7 << 0x38;
LAB_001121a8:
          puVar16 = (ulong *)buf;
          if (uVar6 < 0x6964000000000000) {
            if ((uVar6 & 0x7fffffffff000000) != 0x636f756e74000000) goto switchD_0011214e_default;
            if (5 < (long)uVar10) {
              bVar1 = *(byte *)((long)buf + 5);
              if (ctx->unquoted == 0) {
                if (bVar1 == 0x22) {
                  pbVar13 = (byte *)((long)buf + 6);
                  goto LAB_001122e2;
                }
              }
              else if ((char)bVar1 < '!' || bVar1 == 0x3a) {
                pbVar13 = (byte *)((long)buf + 5);
                ctx->unquoted = 0;
LAB_001122e2:
                if ((long)end - (long)pbVar13 < 2) {
LAB_0011232e:
                  pbVar13 = (byte *)flatcc_json_parser_space_ext(ctx,(char *)pbVar13,end);
                }
                else if ((char)*pbVar13 < '!') {
                  if ((*pbVar13 != 0x20) || ((char)pbVar13[1] < '!')) goto LAB_0011232e;
                  pbVar13 = pbVar13 + 1;
                }
                if ((pbVar13 == (byte *)end) || (*pbVar13 != 0x3a)) {
                  puVar16 = (ulong *)flatcc_json_parser_set_error(ctx,(char *)pbVar13,end,4);
                }
                else {
                  puVar16 = (ulong *)(pbVar13 + 1);
                  if ((long)end - (long)puVar16 < 2) {
LAB_00112499:
                    puVar16 = (ulong *)flatcc_json_parser_space_ext(ctx,(char *)puVar16,end);
                  }
                  else if ((char)(byte)*puVar16 < '!') {
                    if (((byte)*puVar16 != 0x20) || ((char)pbVar13[2] < '!')) goto LAB_00112499;
                    puVar16 = (ulong *)(pbVar13 + 2);
                  }
                }
              }
            }
            if ((ulong *)buf == puVar16) {
LAB_0011262a:
              buf = flatcc_json_parser_unmatched_symbol(ctx,(char *)puVar16,end);
            }
            else {
              local_40 = 0;
              local_48 = local_48 & 0xffffffff00000000;
              local_4c = local_4c & 0xffff0000;
              buf = (char *)puVar16;
              if ((puVar16 != (ulong *)end) &&
                 (buf = flatcc_json_parser_integer
                                  (ctx,(char *)puVar16,end,(int *)&local_48,&local_40),
                 (ulong *)buf != puVar16)) {
                if ((int)local_48 == 0) {
                  if (local_40 < 0x10000) {
                    local_4c = CONCAT22(local_4c._2_2_,(short)local_40);
                    goto LAB_00112531;
                  }
                  iVar3 = 7;
                }
                else {
                  iVar3 = 8;
                }
                buf = flatcc_json_parser_set_error(ctx,buf,end,iVar3);
              }
LAB_00112531:
              if ((puVar16 == (ulong *)buf) &&
                 ((buf = flatcc_json_parser_symbolic_uint16
                                   (ctx,buf,end,
                                    MyGame_Example_Stat_parse_json_table::symbolic_parsers,
                                    (uint16_t *)&local_4c), (ulong *)buf == puVar16 || (buf == end))
                 )) goto LAB_00112031;
              sVar2 = (short)local_4c;
              if (((short)local_4c != 0) || ((ctx->flags & 2) != 0)) {
                psVar8 = (short *)flatcc_builder_table_add(ctx->ctx,2,2,2);
                if (psVar8 == (short *)0x0) goto LAB_00112031;
                *psVar8 = sVar2;
              }
            }
          }
          else if ((uint)(uVar6 >> 0x28) == 0x76616c) {
            if (3 < (long)uVar10) {
              bVar1 = *(byte *)((long)buf + 3);
              if (ctx->unquoted == 0) {
                if (bVar1 == 0x22) {
                  pbVar13 = (byte *)((long)buf + 4);
                  goto LAB_00112310;
                }
              }
              else if ((char)bVar1 < '!' || bVar1 == 0x3a) {
                pbVar13 = (byte *)((long)buf + 3);
                ctx->unquoted = 0;
LAB_00112310:
                if ((long)end - (long)pbVar13 < 2) {
LAB_00112388:
                  pbVar13 = (byte *)flatcc_json_parser_space_ext(ctx,(char *)pbVar13,end);
                }
                else if ((char)*pbVar13 < '!') {
                  if ((*pbVar13 != 0x20) || ((char)pbVar13[1] < '!')) goto LAB_00112388;
                  pbVar13 = pbVar13 + 1;
                }
                if ((pbVar13 == (byte *)end) || (*pbVar13 != 0x3a)) {
                  puVar16 = (ulong *)flatcc_json_parser_set_error(ctx,(char *)pbVar13,end,4);
                }
                else {
                  puVar16 = (ulong *)(pbVar13 + 1);
                  if ((long)end - (long)puVar16 < 2) {
LAB_001125a2:
                    puVar16 = (ulong *)flatcc_json_parser_space_ext(ctx,(char *)puVar16,end);
                  }
                  else if ((char)(byte)*puVar16 < '!') {
                    if (((byte)*puVar16 != 0x20) || ((char)pbVar13[2] < '!')) goto LAB_001125a2;
                    puVar16 = (ulong *)(pbVar13 + 2);
                  }
                }
              }
            }
            if ((ulong *)buf == puVar16) goto LAB_0011262a;
            local_40 = 0;
            local_4c = 0;
            local_48 = 0;
            buf = (char *)puVar16;
            uVar10 = local_48;
            if ((puVar16 != (ulong *)end) &&
               (buf = flatcc_json_parser_integer(ctx,(char *)puVar16,end,(int *)&local_4c,&local_40)
               , uVar10 = local_48, (ulong *)buf != puVar16)) {
              if (local_4c == 0) {
                uVar10 = local_40;
                if ((long)local_40 < 0) {
                  iVar3 = 7;
                  goto LAB_00112653;
                }
              }
              else if (local_40 < 0x8000000000000001) {
                uVar10 = -local_40;
              }
              else {
                iVar3 = 8;
LAB_00112653:
                buf = flatcc_json_parser_set_error(ctx,buf,end,iVar3);
                uVar10 = local_48;
              }
            }
            local_48 = uVar10;
            if ((puVar16 == (ulong *)buf) &&
               ((buf = flatcc_json_parser_symbolic_int64
                                 (ctx,buf,end,
                                  MyGame_Example_Stat_parse_json_table::symbolic_parsers_1,
                                  (int64_t *)&local_48), (ulong *)buf == puVar16 || (buf == end))))
            goto LAB_00112031;
            uVar10 = local_48;
            if ((local_48 != 0) || ((ctx->flags & 2) != 0)) {
              puVar16 = (ulong *)flatcc_builder_table_add(ctx->ctx,1,8,8);
              if (puVar16 == (ulong *)0x0) goto LAB_00112031;
              *puVar16 = uVar10;
            }
          }
          else {
            if ((uVar6 & 0xffff000000000000) != 0x6964000000000000) goto switchD_0011214e_default;
            if (2 < (long)uVar10) {
              bVar1 = *(byte *)((long)buf + 2);
              if (ctx->unquoted == 0) {
                if (bVar1 == 0x22) {
                  pbVar13 = (byte *)((long)buf + 3);
                  goto LAB_00112415;
                }
              }
              else if ((char)bVar1 < '!' || bVar1 == 0x3a) {
                pbVar13 = (byte *)((long)buf + 2);
                ctx->unquoted = 0;
LAB_00112415:
                if ((long)end - (long)pbVar13 < 2) {
LAB_00112433:
                  pbVar13 = (byte *)flatcc_json_parser_space_ext(ctx,(char *)pbVar13,end);
                }
                else if ((char)*pbVar13 < '!') {
                  if ((*pbVar13 != 0x20) || ((char)pbVar13[1] < '!')) goto LAB_00112433;
                  pbVar13 = pbVar13 + 1;
                }
                if ((pbVar13 == (byte *)end) || (*pbVar13 != 0x3a)) {
                  puVar16 = (ulong *)flatcc_json_parser_set_error(ctx,(char *)pbVar13,end,4);
                }
                else {
                  puVar16 = (ulong *)(pbVar13 + 1);
                  if ((long)end - (long)puVar16 < 2) {
LAB_00112700:
                    puVar16 = (ulong *)flatcc_json_parser_space_ext(ctx,(char *)puVar16,end);
                  }
                  else if ((char)(byte)*puVar16 < '!') {
                    if (((byte)*puVar16 != 0x20) || ((char)pbVar13[2] < '!')) goto LAB_00112700;
                    puVar16 = (ulong *)(pbVar13 + 2);
                  }
                }
              }
            }
            bVar17 = (ulong *)buf == puVar16;
            buf = (char *)puVar16;
            if (bVar17) goto switchD_0011214e_default;
            buf = flatcc_json_parser_build_string(ctx,(char *)puVar16,end,&local_34);
            if ((local_34 == 0) ||
               (pfVar9 = flatcc_builder_table_add_offset(ctx->ctx,0),
               pfVar9 == (flatcc_builder_ref_t *)0x0)) goto LAB_00112031;
            *pfVar9 = local_34;
          }
        }
        buf = flatcc_json_parser_object_end(ctx,buf,end,&local_50);
      } while (local_50 != 0);
    }
    else {
      local_50 = 0;
      buf = (char *)((long)puVar16 + 1);
      if ((long)end - (long)buf < 2) {
LAB_00112769:
        buf = flatcc_json_parser_space_ext(ctx,buf,end);
      }
      else if (*buf < '!') {
        if ((*buf != 0x20) || ((char)*(byte *)((long)puVar16 + 2) < '!')) goto LAB_00112769;
        buf = (char *)((long)puVar16 + 2);
      }
    }
  }
  if (ctx->error == 0) {
    fVar4 = flatcc_builder_end_table(ctx->ctx);
    *result = fVar4;
    if (fVar4 != 0) {
      return (char *)(ulong *)buf;
    }
  }
LAB_00112031:
  pcVar5 = flatcc_json_parser_set_error(ctx,buf,end,0x23);
  return pcVar5;
}

Assistant:

static const char *MyGame_Example_Stat_parse_json_table(flatcc_json_parser_t *ctx, const char *buf, const char *end, flatcc_builder_ref_t *result)
{
    int more;
    void *pval;
    flatcc_builder_ref_t ref, *pref;
    const char *mark;
    uint64_t w;

    *result = 0;
    if (flatcc_builder_start_table(ctx->ctx, 3)) goto failed;
    buf = flatcc_json_parser_object_start(ctx, buf, end, &more);
    while (more) {
        buf = flatcc_json_parser_symbol_start(ctx, buf, end);
        w = flatcc_json_parser_symbol_part(buf, end);
        if (w < 0x6964000000000000) { /* branch "id" */
            if ((w & 0xffffffffff000000) == 0x636f756e74000000) { /* "count" */
                buf = flatcc_json_parser_match_symbol(ctx, (mark = buf), end, 5);
                if (mark != buf) {
                    uint16_t val = 0;
                    static flatcc_json_parser_integral_symbol_f *symbolic_parsers[] = {
                            monster_test_local_MyGame_Example_json_parser_enum,
                            monster_test_global_json_parser_enum, 0 };
                    buf = flatcc_json_parser_uint16(ctx, (mark = buf), end, &val);
                    if (mark == buf) {
                        buf = flatcc_json_parser_symbolic_uint16(ctx, (mark = buf), end, symbolic_parsers, &val);
                        if (buf == mark || buf == end) goto failed;
                    }
                    if (val != UINT16_C(0) || (ctx->flags & flatcc_json_parser_f_force_add)) {
                        if (!(pval = flatcc_builder_table_add(ctx->ctx, 2, 2, 2))) goto failed;
                        flatbuffers_uint16_write_to_pe(pval, val);
                    }
                } else {
                    buf = flatcc_json_parser_unmatched_symbol(ctx, buf, end);
                }
            } else { /* "count" */
                buf = flatcc_json_parser_unmatched_symbol(ctx, buf, end);
            } /* "count" */
        } else { /* branch "id" */
            if ((w & 0xffffff0000000000) == 0x76616c0000000000) { /* "val" */
                buf = flatcc_json_parser_match_symbol(ctx, (mark = buf), end, 3);
                if (mark != buf) {
                    int64_t val = 0;
                    static flatcc_json_parser_integral_symbol_f *symbolic_parsers[] = {
                            monster_test_local_MyGame_Example_json_parser_enum,
                            monster_test_global_json_parser_enum, 0 };
                    buf = flatcc_json_parser_int64(ctx, (mark = buf), end, &val);
                    if (mark == buf) {
                        buf = flatcc_json_parser_symbolic_int64(ctx, (mark = buf), end, symbolic_parsers, &val);
                        if (buf == mark || buf == end) goto failed;
                    }
                    if (val != INT64_C(0) || (ctx->flags & flatcc_json_parser_f_force_add)) {
                        if (!(pval = flatcc_builder_table_add(ctx->ctx, 1, 8, 8))) goto failed;
                        flatbuffers_int64_write_to_pe(pval, val);
                    }
                } else {
                    buf = flatcc_json_parser_unmatched_symbol(ctx, buf, end);
                }
            } else { /* "val" */
                if ((w & 0xffff000000000000) == 0x6964000000000000) { /* "id" */
                    buf = flatcc_json_parser_match_symbol(ctx, (mark = buf), end, 2);
                    if (mark != buf) {
                        buf = flatcc_json_parser_build_string(ctx, buf, end, &ref);
                        if (!ref || !(pref = flatcc_builder_table_add_offset(ctx->ctx, 0))) goto failed;
                        *pref = ref;
                    } else {
                        buf = flatcc_json_parser_unmatched_symbol(ctx, buf, end);
                    }
                } else { /* "id" */
                    buf = flatcc_json_parser_unmatched_symbol(ctx, buf, end);
                } /* "id" */
            } /* "val" */
        } /* branch "id" */
        buf = flatcc_json_parser_object_end(ctx, buf, end, &more);
    }
    if (ctx->error) goto failed;
    if (!(*result = flatcc_builder_end_table(ctx->ctx))) goto failed;
    return buf;
failed:
    return flatcc_json_parser_set_error(ctx, buf, end, flatcc_json_parser_error_runtime);
}